

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O0

bool P_ParseUSDF(int lumpnum,FileReader *lump,int lumplen)

{
  bool bVar1;
  CRecoverableError *err;
  undefined1 local_130 [8];
  USDFParser parse;
  int lumplen_local;
  FileReader *lump_local;
  int lumpnum_local;
  
  parse.super_UDMFParserBase.parsedString.Chars._4_4_ = lumplen;
  USDFParser::USDFParser((USDFParser *)local_130);
  bVar1 = USDFParser::Parse((USDFParser *)local_130,lumpnum,lump,
                            parse.super_UDMFParserBase.parsedString.Chars._4_4_);
  USDFParser::~USDFParser((USDFParser *)local_130);
  return bVar1;
}

Assistant:

bool P_ParseUSDF(int lumpnum, FileReader *lump, int lumplen)
{
	USDFParser parse;

	try
	{
		if (!parse.Parse(lumpnum, lump, lumplen))
		{
			// clean up the incomplete dialogue structures here
			return false;
		}
		return true;
	}
	catch(CRecoverableError &err)
	{
		Printf("%s", err.GetMessage());
		return false;
	}
}